

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_setInitialValueByString_Test::TestBody(Variable_setInitialValueByString_Test *this)

{
  char *pcVar1;
  AssertHelper local_c0 [8];
  Message local_b8 [8];
  string a;
  AssertionResult gtest_ar;
  PrinterPtr printer;
  VariablePtr v;
  ModelPtr m;
  ComponentPtr c;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component>\n    <variable initial_value=\"0.0\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)&a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"",(allocator<char> *)&v);
  pcVar1 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"",(allocator<char> *)&printer);
  createModelWithComponent((string *)&m,(string *)&a);
  std::__cxx11::string::~string((string *)&c);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ComponentEntity::component((ulong)&c);
  libcellml::Variable::create();
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"0.0",(allocator<char> *)&printer)
  ;
  libcellml::Variable::setInitialValue
            ((string *)v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__cxx11::string::~string((string *)&a);
  libcellml::Component::addVariable
            ((shared_ptr *)
             c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"e","a",&e,&a);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(local_b8);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0xc4,pcVar1);
    testing::internal::AssertHelper::operator=(local_c0,local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(Variable, setInitialValueByString)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component>\n"
        "    <variable initial_value=\"0.0\"/>\n"
        "  </component>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setInitialValue("0.0");
    c->addVariable(v);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}